

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ispalindrom.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  FILE *pFVar4;
  long lVar5;
  Settings local_40;
  
  name = *argv;
  bVar2 = 0;
  pFVar4 = _stdout;
  while( true ) {
    while( true ) {
      while (iVar3 = __posix_getopt(argc,argv,"sio:"), iVar1 = _optind, iVar3 == 0x6f) {
        if (pFVar4 != _stdout) {
          fclose(pFVar4);
        }
        pFVar4 = fopen(_optarg,"w");
      }
      if (iVar3 != 0x69) break;
      bVar2 = bVar2 | 2;
    }
    if (iVar3 != 0x73) break;
    bVar2 = bVar2 | 1;
  }
  if (iVar3 == -1) {
    local_40._0_1_ = bVar2;
    local_40.output = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      if (_optind < argc) {
        iVar3 = argc - _optind;
        lVar5 = 0;
        do {
          pFVar4 = fopen(argv[iVar1 + lVar5],"r");
          if (pFVar4 == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR:\t",name);
            fprintf(_stderr,"couldn\'t open file %s",argv[iVar1 + lVar5]);
            fputc(10,_stderr);
          }
          else {
            handle_file((FILE *)pFVar4,&local_40);
            fclose(pFVar4);
          }
          lVar5 = lVar5 + 1;
        } while (iVar3 != (int)lVar5);
      }
      else {
        handle_file(_stdin,&local_40);
      }
      exit(0);
    }
    fprintf(_stderr,"%s ERROR:\t",name);
    fwrite("couldn\'t open output-file",0x19,1,_stderr);
    fputc(10,_stderr);
  }
  else {
    fprintf(_stdout,"USAGE: %s [-s] [-i] [-o outfile] [file...]\n",name);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{

	name = argv[0];

	Settings set = {0, 0, stdout};

	int i = handle_arguments(&set, argc, &argv);

	if (i >= argc) //no additional arguments, read from stdin
	{ 
		handle_file(stdin, &set);
	}
	else
	{
		for (; i < argc; i++)
		{

			FILE *input = fopen(argv[i], "r");
			if (input == NULL)
			{
				ERROR_MSG("couldn't open file %s", argv[i]); //give warning, ignore file and continue
				continue;
			}
			handle_file(input, &set);
			fclose(input);
		}
	}
	exit(EXIT_SUCCESS);
}